

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O0

bool __thiscall QWidgetAction::event(QWidgetAction *this,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  QWidgetActionPrivate *pQVar4;
  long lVar5;
  qsizetype qVar6;
  const_reference ppQVar7;
  QEvent *in_RSI;
  QEvent *in_RDI;
  int i;
  QWidgetActionPrivate *d;
  qsizetype in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 uVar8;
  QWidget *in_stack_ffffffffffffffd0;
  int local_1c;
  
  uVar8 = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  pQVar4 = d_func((QWidgetAction *)0x4b1041);
  TVar3 = QEvent::type(in_RSI);
  if (TVar3 == ActionChanged) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x4b106a);
    if (bVar1) {
      in_stack_ffffffffffffffd0 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x4b1081);
      QAction::isEnabled();
      QWidget::setEnabled(in_stack_ffffffffffffffd0,(bool)uVar8);
    }
    local_1c = 0;
    while( true ) {
      lVar5 = (long)local_1c;
      qVar6 = QList<QWidget_*>::size(&pQVar4->createdWidgets);
      if (qVar6 <= lVar5) break;
      ppQVar7 = QList<QWidget_*>::at
                          ((QList<QWidget_*> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      uVar8 = (undefined1)((ulong)lVar5 >> 0x38);
      in_stack_ffffffffffffffc0 = *ppQVar7;
      QAction::isEnabled();
      QWidget::setEnabled(in_stack_ffffffffffffffd0,(bool)uVar8);
      local_1c = local_1c + 1;
    }
  }
  bVar2 = QAction::event(in_RDI);
  return (bool)(bVar2 & 1);
}

Assistant:

bool QWidgetAction::event(QEvent *event)
{
    Q_D(QWidgetAction);
    if (event->type() == QEvent::ActionChanged) {
        if (d->defaultWidget)
            d->defaultWidget->setEnabled(isEnabled());
        for (int i = 0; i < d->createdWidgets.size(); ++i)
            d->createdWidgets.at(i)->setEnabled(isEnabled());
    }
    return QAction::event(event);
}